

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
read_rna(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *input)

{
  iterator __position;
  char cVar1;
  long *plVar2;
  ostream *poVar3;
  char byte;
  string line;
  ifstream fin;
  char local_255;
  int local_254;
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240 [16];
  char local_230 [520];
  
  std::ifstream::ifstream(local_230,(string *)input,_S_in);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248 = 0;
  local_240[0] = 0;
  local_250 = local_240;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      plVar2 = (long *)std::istream::get(local_230);
      if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
      if ((local_255 != '\n') && (local_255 != '\r')) {
        local_254 = to_int(local_255);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (__return_storage_ptr__,__position,&local_254);
        }
        else {
          *__position._M_current = local_254;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
    }
    if (local_250 != local_240) {
      operator_delete(local_250);
    }
    std::ifstream::~ifstream(local_230);
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Could not open the RNA file - \'",0x1f);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(input->_M_dataplus)._M_p,input->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

vector<int> read_rna(string & input) {
    ifstream fin(input);
    vector<int> rna;
    string line;
    char byte;
    if (!fin.is_open()) {
        cout << "Could not open the RNA file - '" << input << "'" << endl;
        exit(1);
    }
    if (fin.is_open()) {

        while (fin.get(byte)) {
            if (byte != '\n' && byte != '\r') {
                rna.push_back(to_int(byte));
            }
        }
    }
    return rna;
}